

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (2 < current->_M_string_length) {
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)current);
    bVar1 = ::std::operator==(&local_50,"--");
    if (bVar1) {
      bVar1 = valid_first_char<char>((current->_M_dataplus)._M_p[2]);
      ::std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        lVar2 = ::std::__cxx11::string::find((char *)current,0x12aac7);
        if (lVar2 == -1) {
          ::std::__cxx11::string::substr((ulong)&local_50,(ulong)current);
          ::std::__cxx11::string::operator=((string *)name,(string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
          ::std::__cxx11::string::assign((char *)value);
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_50,(ulong)current);
          ::std::__cxx11::string::operator=((string *)name,(string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
          ::std::__cxx11::string::substr((ulong)&local_50,(ulong)current);
          ::std::__cxx11::string::operator=((string *)value,(string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        return true;
      }
    }
    else {
      ::std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return false;
}

Assistant:

inline bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.substr(0, 2) == "--" && valid_first_char(current[2])) {
        auto loc = current.find("=");
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    } else
        return false;
}